

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskamain.c
# Opt level: O3

err_t MATROSKA_LinkBlockWriteTrack(matroska_block *Block,ebml_master *Track,int ForProfile)

{
  ebml_master *peVar1;
  ebml_context *peVar2;
  bool_t bVar3;
  ebml_integer *Element;
  err_t eVar4;
  int64_t iVar5;
  ebml_master *local_28;
  
  peVar1 = Block->WriteTrack;
  local_28 = Track;
  peVar2 = MATROSKA_getContextTrackEntry();
  bVar3 = EBML_ElementIsType(&Track->Base,peVar2);
  if (bVar3 == 0) {
    __assert_fail("EBML_ElementIsType((ebml_element*)Track, MATROSKA_getContextTrackEntry())",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                  ,0x168,"err_t MATROSKA_LinkBlockWriteTrack(matroska_block *, ebml_master *, int)")
    ;
  }
  bVar3 = Node_IsPartOf(Block,0x4c424b4d);
  if (bVar3 != 0) {
    peVar2 = MATROSKA_getContextTrackNumber();
    Element = (ebml_integer *)EBML_MasterFindFirstElt(Track,peVar2,0,0,0);
    eVar4 = -3;
    if ((Element != (ebml_integer *)0x0) && ((Element->Base).bValueIsSet != '\0')) {
      iVar5 = EBML_IntegerValue(Element);
      Block->TrackNumber = (uint16_t)iVar5;
      (**(code **)((long)(Block->Base).Base.Base.Base.VMT + 0x20))(Block,0x182,&local_28,8);
      if (peVar1 == (ebml_master *)0x0) {
        eVar4 = CheckCompression(Block,ForProfile);
      }
      else {
        eVar4 = 0;
      }
    }
    return eVar4;
  }
  __assert_fail("Node_IsPartOf(Block,MATROSKA_BLOCK_CLASS)",
                "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                ,0x169,"err_t MATROSKA_LinkBlockWriteTrack(matroska_block *, ebml_master *, int)");
}

Assistant:

err_t MATROSKA_LinkBlockWriteTrack(matroska_block *Block, ebml_master *Track, int ForProfile)
{
    ebml_integer *TrackNum;
    bool_t WasLinked = Block->WriteTrack!=NULL;

    assert(EBML_ElementIsType((ebml_element*)Track, MATROSKA_getContextTrackEntry()));
    assert(Node_IsPartOf(Block,MATROSKA_BLOCK_CLASS));
    TrackNum = (ebml_integer*)EBML_MasterFindChild(Track,MATROSKA_getContextTrackNumber());
    if (TrackNum && ((ebml_element*)TrackNum)->bValueIsSet)
    {
        Block->TrackNumber = (uint16_t)EBML_IntegerValue(TrackNum);
        Node_SET(Block,MATROSKA_BLOCK_WRITE_TRACK,&Track);
        if (WasLinked)
            return ERR_NONE;
        return CheckCompression(Block, ForProfile);
    }
    return ERR_INVALID_DATA;
}